

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_structural_infix_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos676;
  int yypos676;
  int yythunkpos674;
  int yypos674;
  int yythunkpos672;
  int yypos672;
  int yythunkpos670;
  int yypos670;
  int yythunkpos668;
  int yypos668;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar5 = yy_named_unary_expr(G);
  if (iVar5 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    return 0;
  }
  yyDo(G,yySet,-2,0,"yySet");
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar6 = yy__(G);
  if ((iVar6 != 0) && (iVar6 = yymatchString(G,".."), iVar6 != 0)) {
    iVar6 = G->pos;
    iVar4 = G->thunkpos;
    iVar7 = yymatchChar(G,0x2e);
    if (iVar7 == 0) {
      G->pos = iVar6;
      G->thunkpos = iVar4;
      iVar6 = yy__(G);
      if ((iVar6 != 0) && (iVar6 = yy_named_unary_expr(G), iVar6 != 0)) {
        yyDo(G,yySet,-1,0,"yySet");
        yyDo(G,yy_1_structural_infix_expr,G->begin,G->end,"yy_1_structural_infix_expr");
        goto LAB_0011c031;
      }
    }
  }
  G->pos = iVar5;
  G->thunkpos = iVar3;
  iVar6 = yy__(G);
  if ((iVar6 != 0) && (iVar6 = yymatchString(G,"cmp"), iVar6 != 0)) {
    iVar6 = G->pos;
    iVar4 = G->thunkpos;
    iVar7 = yymatchClass(G,(uchar *)"","a-z");
    if (iVar7 == 0) {
      G->pos = iVar6;
      G->thunkpos = iVar4;
      iVar6 = yy__(G);
      if ((iVar6 != 0) && (iVar6 = yy_named_unary_expr(G), iVar6 != 0)) {
        yyDo(G,yySet,-1,0,"yySet");
        yyDo(G,yy_2_structural_infix_expr,G->begin,G->end,"yy_2_structural_infix_expr");
        goto LAB_0011c031;
      }
    }
  }
  G->pos = iVar5;
  G->thunkpos = iVar3;
  iVar6 = yy__(G);
  if ((iVar6 != 0) && (iVar6 = yymatchString(G,"leg"), iVar6 != 0)) {
    iVar6 = G->pos;
    iVar4 = G->thunkpos;
    iVar7 = yymatchClass(G,(uchar *)"","a-z");
    if (iVar7 == 0) {
      G->pos = iVar6;
      G->thunkpos = iVar4;
      iVar6 = yy__(G);
      if ((iVar6 != 0) && (iVar6 = yy_named_unary_expr(G), iVar6 != 0)) {
        yyDo(G,yySet,-1,0,"yySet");
        yyDo(G,yy_3_structural_infix_expr,G->begin,G->end,"yy_3_structural_infix_expr");
        goto LAB_0011c031;
      }
    }
  }
  G->pos = iVar5;
  G->thunkpos = iVar3;
  iVar5 = yy__(G);
  if ((((iVar5 == 0) || (iVar5 = yymatchString(G,"<=>"), iVar5 == 0)) ||
      (iVar5 = yy__(G), iVar5 == 0)) || (iVar5 = yy_named_unary_expr(G), iVar5 == 0)) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_4_structural_infix_expr,G->begin,G->end,"yy_4_structural_infix_expr");
  }
LAB_0011c031:
  yyDo(G,yy_5_structural_infix_expr,G->begin,G->end,"yy_5_structural_infix_expr");
  yyDo(G,yyPop,2,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_structural_infix_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "structural_infix_expr"));
  if (!yy_named_unary_expr(G))  goto l667;
  yyDo(G, yySet, -2, 0, "yySet");

  {  int yypos668= G->pos, yythunkpos668= G->thunkpos;
  {  int yypos670= G->pos, yythunkpos670= G->thunkpos;  if (!yy__(G))  goto l671;
  if (!yymatchString(G, "..")) goto l671;

  {  int yypos672= G->pos, yythunkpos672= G->thunkpos;  if (!yymatchChar(G, '.')) goto l672;
  goto l671;
  l672:;	  G->pos= yypos672; G->thunkpos= yythunkpos672;
  }  if (!yy__(G))  goto l671;
  if (!yy_named_unary_expr(G))  goto l671;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_structural_infix_expr, G->begin, G->end, "yy_1_structural_infix_expr");
  goto l670;
  l671:;	  G->pos= yypos670; G->thunkpos= yythunkpos670;  if (!yy__(G))  goto l673;
  if (!yymatchString(G, "cmp")) goto l673;

  {  int yypos674= G->pos, yythunkpos674= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\000\000\000\000\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-z")) goto l674;
  goto l673;
  l674:;	  G->pos= yypos674; G->thunkpos= yythunkpos674;
  }  if (!yy__(G))  goto l673;
  if (!yy_named_unary_expr(G))  goto l673;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_structural_infix_expr, G->begin, G->end, "yy_2_structural_infix_expr");
  goto l670;
  l673:;	  G->pos= yypos670; G->thunkpos= yythunkpos670;  if (!yy__(G))  goto l675;
  if (!yymatchString(G, "leg")) goto l675;

  {  int yypos676= G->pos, yythunkpos676= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\000\000\000\000\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-z")) goto l676;
  goto l675;
  l676:;	  G->pos= yypos676; G->thunkpos= yythunkpos676;
  }  if (!yy__(G))  goto l675;
  if (!yy_named_unary_expr(G))  goto l675;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_structural_infix_expr, G->begin, G->end, "yy_3_structural_infix_expr");
  goto l670;
  l675:;	  G->pos= yypos670; G->thunkpos= yythunkpos670;  if (!yy__(G))  goto l668;
  if (!yymatchString(G, "<=>")) goto l668;
  if (!yy__(G))  goto l668;
  if (!yy_named_unary_expr(G))  goto l668;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_structural_infix_expr, G->begin, G->end, "yy_4_structural_infix_expr");

  }
  l670:;	  goto l669;
  l668:;	  G->pos= yypos668; G->thunkpos= yythunkpos668;
  }
  l669:;	  yyDo(G, yy_5_structural_infix_expr, G->begin, G->end, "yy_5_structural_infix_expr");
  yyprintf((stderr, "  ok   structural_infix_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l667:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "structural_infix_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}